

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InvertDatabase.cc
# Opt level: O1

void __thiscall
InvertDatabase::print_idlist
          (InvertDatabase *this,ostream *idlstrm,
          shared_ptr<std::vector<int,_std::allocator<int>_>_> *ival,int supsz)

{
  pointer piVar1;
  ostream *poVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  
  if (0 < supsz) {
    piVar1 = (((ival->
               super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>
               )._M_ptr)->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    iVar3 = *piVar1;
    iVar5 = 0;
    iVar4 = 0;
    do {
      if (iVar3 == piVar1[iVar5]) {
        iVar4 = iVar4 + 1;
        iVar5 = iVar5 + 2;
      }
      else {
        poVar2 = (ostream *)std::ostream::operator<<((ostream *)idlstrm,iVar3);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
        poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,iVar4);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
        iVar3 = piVar1[iVar5];
        iVar4 = 0;
      }
    } while (iVar5 < supsz);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)idlstrm,iVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
    std::ostream::operator<<((ostream *)poVar2,iVar4);
    return;
  }
  return;
}

Assistant:

void InvertDatabase::print_idlist(ostream& idlstrm, shared_ptr<vint> ival, int supsz) {
    int i, cid, cnt;
    int *ival_data = ival->data();

    if (supsz > 0) {
        cid = ival_data[0];
        cnt = 0;
        for (i = 0; i < supsz;) {
            if (cid == ival_data[i]) {
                cnt++;
                i += 2;
            } else {
                idlstrm << cid << " " << cnt << " ";
                cid = ival_data[i];
                cnt = 0;
            }
        }
        idlstrm << cid << " " << cnt;
    }
}